

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O1

void __thiscall duckdb::HLLV1::FromNew(HLLV1 *this,HyperLogLog *new_hll)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uint64_t uVar4;
  idx_t iVar5;
  idx_t i;
  long lVar6;
  size_t index;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double newd;
  uint32_t c [60];
  double local_198;
  uint32_t local_128 [62];
  
  lVar6 = 0;
  switchD_01306cb1::default(local_128,0,0xf0);
  do {
    local_128[new_hll->k[lVar6]] = local_128[new_hll->k[lVar6]] + 1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x40);
  uVar3 = HyperLogLog::EstimateCardinality(local_128);
  if (uVar3 != 0) {
    uVar4 = duckdb_hll::num_registers();
    uVar9 = uVar4 >> 6;
    dVar14 = 0.0;
    sVar8 = 0;
    lVar6 = 0;
    do {
      bVar2 = new_hll->k[lVar6];
      bVar1 = duckdb_hll::maximum_zeros();
      if (bVar2 < bVar1) {
        bVar1 = bVar2;
      }
      duckdb_hll::set_register(this->hll,sVar8,bVar1);
      dVar14 = dVar14 + (double)bVar1;
      lVar6 = lVar6 + 1;
      sVar8 = sVar8 + uVar9;
    } while (lVar6 != 0x40);
    dVar14 = dVar14 * 0.015625;
    if (dVar14 <= 10.0) {
      if (2.0 < dVar14) {
        dVar14 = dVar14 + -2.0;
      }
    }
    else {
      dVar14 = dVar14 * 0.75;
    }
    auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)uVar3);
    auVar12._8_4_ = (int)(uVar3 >> 0x20);
    auVar12._12_4_ = 0x45300000;
    dVar15 = (auVar12._8_8_ - 1.9342813113834067e+25) + (auVar12._0_8_ - 4503599627370496.0);
    local_198 = 0.0;
    lVar6 = 0;
    do {
      iVar5 = Count(this);
      auVar13._8_4_ = (int)(iVar5 >> 0x20);
      auVar13._0_8_ = iVar5;
      auVar13._12_4_ = 0x45300000;
      dVar16 = (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)iVar5) - 4503599627370496.0);
      dVar17 = dVar15;
      if (dVar15 <= dVar16) {
        dVar17 = dVar16;
      }
      dVar18 = dVar15;
      if (dVar16 <= dVar15) {
        dVar18 = dVar16;
      }
      if (dVar17 / dVar18 < 1.2) {
        return;
      }
      lVar6 = lVar6 + 1;
      dVar17 = dVar14 / (double)(1 << ((byte)lVar6 & 0x1f));
      iVar5 = Count(this);
      if (uVar3 < iVar5) {
        local_198 = (double)(~-(ulong)(local_198 < dVar17) & (ulong)(local_198 - dVar17));
      }
      else {
        local_198 = local_198 + dVar17;
      }
      dVar17 = floor(local_198);
      dVar16 = ceil(local_198);
      sVar8 = 1;
      lVar10 = 0;
      do {
        bVar2 = new_hll->k[lVar10];
        bVar1 = duckdb_hll::maximum_zeros();
        if (bVar2 < bVar1) {
          bVar1 = bVar2;
        }
        uVar11 = -(ulong)((double)lVar10 * 0.015625 < (dVar17 - local_198) + 1.0);
        bVar2 = (byte)(int)(double)(~uVar11 & (ulong)dVar16 | uVar11 & (ulong)dVar17);
        if (bVar2 < bVar1) {
          bVar1 = bVar2;
        }
        index = sVar8;
        lVar7 = uVar9 - 1;
        if (0x7f < uVar4) {
          do {
            duckdb_hll::set_register(this->hll,index,bVar1);
            lVar7 = lVar7 + -1;
            index = index + 1;
          } while (lVar7 != 0);
        }
        lVar10 = lVar10 + 1;
        sVar8 = sVar8 + uVar9;
      } while (lVar10 != 0x40);
    } while (lVar6 != 5);
  }
  return;
}

Assistant:

void FromNew(const HyperLogLog &new_hll) {
		const auto new_hll_count = new_hll.Count();
		if (new_hll_count == 0) {
			return;
		}

		const idx_t mult = duckdb_hll::num_registers() / HyperLogLog::M;
		// When going from less to more registers, we cannot just duplicate the registers,
		// as each register in the new HLL is the minimum of 'mult' registers in the old HLL.
		// Duplicating will make for VERY large over-estimations. Instead, we do the following:

		// Set the first of every 'mult' registers in the old HLL to the value in the new HLL
		// This ensures that we can convert NEW to OLD and back to NEW without loss of information
		double avg = 0;
		for (idx_t i = 0; i < HyperLogLog::M; i++) {
			const auto max_new = MinValue(new_hll.GetRegister(i), duckdb_hll::maximum_zeros());
			duckdb_hll::set_register(hll, i * mult, max_new);
			avg += static_cast<double>(max_new);
		}
		avg /= static_cast<double>(HyperLogLog::M);

		// Using the average will ALWAYS overestimate, so we reduce it a bit here
		if (avg > 10) {
			avg *= 0.75;
		} else if (avg > 2) {
			avg -= 2;
		}

		// Set all other registers to a default value, starting with 0 (the initialization value)
		// We optimize the default value in 5 iterations or until OLD count is close to NEW count
		double default_val = 0;
		for (idx_t opt_idx = 0; opt_idx < 5; opt_idx++) {
			if (IsWithinAcceptableRange(new_hll_count, Count())) {
				break;
			}

			// Delta is half the average, then a quarter, etc.
			const double delta = avg / static_cast<double>(1 << (opt_idx + 1));
			if (Count() > new_hll_count) {
				default_val = delta > default_val ? 0 : default_val - delta;
			} else {
				default_val += delta;
			}

			// If the default value is, e.g., 3.3, then the first 70% gets value 3, and the rest gets value 4
			const double floor_fraction = 1 - (default_val - floor(default_val));
			for (idx_t i = 0; i < HyperLogLog::M; i++) {
				const auto max_new = MinValue(new_hll.GetRegister(i), duckdb_hll::maximum_zeros());
				uint8_t register_value;
				if (static_cast<double>(i) / static_cast<double>(HyperLogLog::M) < floor_fraction) {
					register_value = ExactNumericCast<uint8_t>(floor(default_val));
				} else {
					register_value = ExactNumericCast<uint8_t>(ceil(default_val));
				}
				register_value = MinValue(register_value, max_new);
				for (idx_t j = 1; j < mult; j++) {
					D_ASSERT(i * mult + j < duckdb_hll::num_registers());
					duckdb_hll::set_register(hll, i * mult + j, register_value);
				}
			}
		}
	}